

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6240a::TestXmlTestReporterFixtureMultipleFailures::RunImpl
          (TestXmlTestReporterFixtureMultipleFailures *this)

{
  TestDetails *details;
  XmlTestReporterFixtureMultipleFailuresHelper fixtureHelper;
  undefined1 auStack_1d8 [376];
  TestReporter local_60;
  vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_> local_58;
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  XmlTestReporterFixture::XmlTestReporterFixture((XmlTestReporterFixture *)auStack_1d8);
  local_38 = details;
  UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureMultipleFailuresHelper>
            ((XmlTestReporterFixtureMultipleFailuresHelper *)auStack_1d8,details);
  local_60._vptr_TestReporter = (_func_int **)&PTR__DeferredTestReporter_00152c28;
  std::vector<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>::~vector
            (&local_58);
  UnitTest::TestReporter::~TestReporter(&local_60);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1d8);
  std::ios_base::~ios_base((ios_base *)(auStack_1d8 + 0x70));
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, MultipleFailures)
{
    TestDetails const failedDetails1("FailedTest", "suite", "fail.h", 1);
    TestDetails const failedDetails2("FailedTest", "suite", "fail.h", 31);

    reporter.ReportTestStart(failedDetails1);
    reporter.ReportFailure(failedDetails1, "expected 1 but was 2");
    reporter.ReportFailure(failedDetails2, "expected one but was two");
    reporter.ReportTestFinish(failedDetails1, 0.1f);

    reporter.ReportSummary(1, 1, 2, 1.1f);

    char const* expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"2\" time=\"1.1\">"
        "<test suite=\"suite\" name=\"FailedTest\" time=\"0.1\">"
        "<failure message=\"fail.h(1) : expected 1 but was 2\"/>"
        "<failure message=\"fail.h(31) : expected one but was two\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}